

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O1

void __thiscall pg::FPISolver::runSeq(FPISolver *this)

{
  bitset *this_00;
  uint uVar1;
  uint64_t *puVar2;
  char cVar3;
  bitset *pbVar4;
  int iVar5;
  int *piVar6;
  void *pvVar7;
  void *pvVar8;
  Game *pGVar9;
  ostream *poVar10;
  bool bVar11;
  char *pcVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint64_t uVar18;
  long lVar19;
  _label_vertex local_48;
  bitset *local_38;
  
  local_38 = &this->distraction;
  bitset::resize(local_38,((this->super_Solver).game)->n_vertices);
  pGVar9 = (this->super_Solver).game;
  piVar6 = (int *)operator_new__(-(ulong)((ulong)pGVar9->n_vertices >> 0x3e != 0) |
                                 pGVar9->n_vertices << 2);
  this->strategy = piVar6;
  piVar6 = (int *)operator_new__(-(ulong)((ulong)pGVar9->n_vertices >> 0x3e != 0) |
                                 pGVar9->n_vertices << 2);
  this->frozen = piVar6;
  uVar16 = 0;
  memset(piVar6,0,pGVar9->n_vertices << 2);
  uVar1 = *(uint *)((long)pGVar9->_priority + ((pGVar9->n_vertices << 0x20) + -0x100000000 >> 0x1e))
  ;
  lVar19 = (long)(int)uVar1;
  uVar13 = 0xffffffffffffffff;
  if (-2 < lVar19) {
    uVar13 = lVar19 * 4 + 4;
  }
  pvVar7 = operator_new__(uVar13);
  pvVar8 = operator_new__(uVar13);
  this_00 = &this->parity;
  bitset::resize(this_00,pGVar9->n_vertices);
  if (-1 < lVar19) {
    pGVar9 = (this->super_Solver).game;
    piVar6 = pGVar9->_priority;
    uVar13 = 0;
    do {
      iVar14 = (int)uVar16;
      uVar15 = (ulong)iVar14;
      if (uVar13 == (uint)piVar6[uVar15]) {
        *(int *)((long)pvVar7 + uVar13 * 4) = iVar14;
        if ((long)uVar15 < pGVar9->n_vertices) {
          puVar2 = this_00->_bits;
          do {
            if (uVar13 != (uint)piVar6[uVar15]) break;
            uVar16 = uVar15 >> 6;
            uVar17 = 1L << (uVar15 & 0x3f);
            if ((uVar13 & 1) == 0) {
              uVar18 = ~uVar17 & puVar2[uVar16];
            }
            else {
              uVar18 = uVar17 | puVar2[uVar16];
            }
            puVar2[uVar16] = uVar18;
            uVar15 = uVar15 + 1;
          } while ((long)uVar15 < pGVar9->n_vertices);
          uVar16 = uVar15 & 0xffffffff;
        }
        iVar14 = (int)uVar16 - iVar14;
      }
      else {
        *(undefined4 *)((long)pvVar7 + uVar13 * 4) = 0xffffffff;
        iVar14 = 0;
      }
      *(int *)((long)pvVar8 + uVar13 * 4) = iVar14;
      uVar13 = uVar13 + 1;
    } while (uVar13 != (ulong)uVar1 + 1);
  }
  this->iterations = 1;
  if (-1 < (int)uVar1) {
    iVar14 = 0;
    do {
      lVar19 = (long)iVar14;
      iVar5 = *(int *)((long)pvVar8 + lVar19 * 4);
      if (iVar5 == 0) {
LAB_0015a3f7:
        iVar14 = iVar14 + 1;
      }
      else {
        iVar5 = updateBlock(this,*(int *)((long)pvVar7 + lVar19 * 4),iVar5);
        if (iVar5 == 0) goto LAB_0015a3f7;
        if (iVar14 != 0) {
          freezeThawReset(this,0,*(int *)((long)pvVar7 + lVar19 * 4),iVar14);
        }
        this->iterations = this->iterations + 1;
        iVar14 = 0;
        if (1 < (this->super_Solver).trace) {
          poVar10 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,"restarting after finding distractions",0x25);
          std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
        }
      }
    } while (iVar14 <= (int)uVar1);
  }
  pbVar4 = local_38;
  pGVar9 = (this->super_Solver).game;
  if (0 < pGVar9->n_vertices) {
    uVar13 = 0;
    do {
      uVar16 = uVar13 >> 6;
      if ((((this->super_Solver).disabled)->_bits[uVar16] >> (uVar13 & 0x3f) & 1) == 0) {
        uVar15 = 1L << (uVar13 & 0x3f);
        bVar11 = ((pbVar4->_bits[uVar16] & uVar15) != 0) != ((this_00->_bits[uVar16] & uVar15) != 0)
        ;
        iVar14 = -1;
        if (bVar11 != (((pGVar9->_owner)._bits[uVar16] >> (uVar13 & 0x3f) & 1) == 0)) {
          iVar14 = this->strategy[uVar13];
        }
        Oink::solve((this->super_Solver).oink,(int)uVar13,(uint)bVar11,iVar14);
      }
      uVar13 = uVar13 + 1;
      pGVar9 = (this->super_Solver).game;
    } while ((long)uVar13 < pGVar9->n_vertices);
  }
  if (this->strategy != (int *)0x0) {
    operator_delete__(this->strategy);
  }
  if (this->frozen != (int *)0x0) {
    operator_delete__(this->frozen);
  }
  operator_delete__(pvVar7);
  operator_delete__(pvVar8);
  poVar10 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"solved with ",0xc);
  poVar10 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," iterations.",0xc);
  std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  if ((this->super_Solver).trace != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->super_Solver).logger,"Distractions:\n",0xe);
    if (0 < ((this->super_Solver).game)->n_vertices) {
      uVar13 = 0;
      do {
        poVar10 = (this->super_Solver).logger;
        if (((this->distraction)._bits[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0) {
          lVar19 = 0xc;
          pcVar12 = "\x1b[1;38:5:34m";
        }
        else {
          lVar19 = 0xd;
          pcVar12 = "\x1b[1;38:5:124m";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,lVar19);
        local_48.g = (this->super_Solver).game;
        local_48.v = (int)uVar13;
        poVar10 = operator<<(poVar10,&local_48);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\x1b[m",3);
        poVar10 = (this->super_Solver).logger;
        cVar3 = (char)poVar10;
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        uVar13 = uVar13 + 1;
      } while ((long)uVar13 < ((this->super_Solver).game)->n_vertices);
    }
  }
  return;
}

Assistant:

void
FPISolver::runSeq()
{
    /**
     * Allocate and initialize data structures
     */
    distraction.resize(nodecount());
    strategy = new int[nodecount()]; // the current strategy for winning the game
    frozen = new int[nodecount()]; // records for every vertex at which level it is frozen (or 0 if not frozen)
    memset(frozen, 0, sizeof(int[nodecount()])); // initially no vertex is frozen (we don't freeze at level 0)

    int d = priority(nodecount()-1);
    int *p_start = new int[d+1];
    int *p_len = new int[d+1];
    parity.resize(nodecount());

    /**
     * Initialize p_start, p_len, parity
     */
    int v=0;
    for (int p=0; p<=d; p++) {
        if (priority(v) == p) {
            p_start[p] = v;
            while (v < nodecount() and priority(v) == p) {
                parity[v] = p&1;
                v++;
            }
            p_len[p] = v - p_start[p];
        } else {
            p_start[p] = -1;
            p_len[p] = 0;
        }
    }

    /**
     * The main loop
     */
    iterations = 1;
    int p = 0;
    while (p <= d) {
        if (p_len[p] == 0 or updateBlock(p_start[p], p_len[p]) == 0) {
            p++;
            continue;
        } 

        if (p != 0) {
            // actually we don't freeze at priority 0 :-)
            freezeThawReset(0, p_start[p] /* +p_len[p] */, p);
            p = 0;
        }

        iterations++;
#ifndef NDEBUG
        if (trace >= 2) logger << "restarting after finding distractions" << std::endl;
#endif
    }

    /**
     * Done, now tell Oink the solution
     */
    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        const int winner = parity[v] ^ distraction[v];
        Solver::solve(v, winner, winner == owner(v) ? strategy[v] : -1);
    }

    /**
     * Free allocated data structures
     */
    delete[] strategy;
    delete[] frozen;
    delete[] p_start;
    delete[] p_len;

    logger << "solved with " << iterations << " iterations." << std::endl;

#ifndef NDEBUG
    if (trace) {
        logger << "Distractions:\n";
        for (int v=0; v<nodecount(); v++) {
            if (distraction[v]) logger << "\033[1;38:5:124m" << label_vertex(v) << "\033[m";
            else logger << "\033[1;38:5:34m" << label_vertex(v) << "\033[m";
            logger << std::endl;
        }
    }
#endif
}